

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

string * __thiscall
cfgfile::generator::generate_type_of_data_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,field_t *f)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  field_type_t fVar5;
  string *psVar6;
  string *extraout_RAX;
  long *plVar7;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  ulong *puVar8;
  char *pcVar9;
  ulong uVar10;
  ulong *local_80;
  long local_78;
  ulong local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  fVar5 = cfg::field_t::type((field_t *)this);
  switch(fVar5) {
  case scalar_field_type:
  case custom_tag_field_type:
    psVar6 = cfg::field_t::value_type_abi_cxx11_((field_t *)this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar6->_M_string_length);
    return extraout_RAX;
  case no_value_field_type:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "bool";
    pcVar4 = "bool";
    break;
  case scalar_vector_field_type:
  case vector_of_tags_field_type:
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"std::vector< ","");
    psVar6 = cfg::field_t::value_type_abi_cxx11_((field_t *)this);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(psVar6->_M_dataplus)._M_p);
    puVar8 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar8) {
      local_70 = *puVar8;
      uStack_68 = (undefined4)plVar7[3];
      uStack_64 = *(undefined4 *)((long)plVar7 + 0x1c);
      local_80 = &local_70;
    }
    else {
      local_70 = *puVar8;
      local_80 = (ulong *)*plVar7;
    }
    local_78 = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," >","");
    uVar10 = 0xf;
    if (local_80 != &local_70) {
      uVar10 = local_70;
    }
    if (uVar10 < (ulong)(local_58 + local_78)) {
      uVar10 = 0xf;
      if (local_60 != local_50) {
        uVar10 = local_50[0];
      }
      if ((ulong)(local_58 + local_78) <= uVar10) {
        psVar6 = (string *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
        goto LAB_0011c03a;
      }
    }
    psVar6 = (string *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60);
LAB_0011c03a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    paVar1 = &psVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&psVar6->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = psVar6->_M_string_length;
    (psVar6->_M_dataplus)._M_p = (pointer)paVar1;
    psVar6->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
      psVar6 = extraout_RAX_01;
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
      psVar6 = extraout_RAX_02;
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
      psVar6 = extraout_RAX_03;
    }
    return psVar6;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "void";
    pcVar4 = "void";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar9,pcVar4 + 4);
  return extraout_RAX_00;
}

Assistant:

static inline std::string generate_type_of_data( const cfg::field_t & f )
{
	switch( f.type() )
	{
		case cfg::field_t::no_value_field_type :
			return std::string( "bool" );

		case cfg::field_t::custom_tag_field_type :
		case cfg::field_t::scalar_field_type :
			return f.value_type();

		case cfg::field_t::vector_of_tags_field_type :
		case cfg::field_t::scalar_vector_field_type :
			return std::string( "std::vector< " ) + f.value_type() + std::string( " >" );

		default :
			return std::string( "void" );
	}
}